

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O0

bool __thiscall
HighsSplitDeque::leapfrogStolenTask(HighsSplitDeque *this,HighsTask *task,HighsSplitDeque **stealer)

{
  HighsSplitDeque *pHVar1;
  HighsTask *pHVar2;
  long *in_RDX;
  bool *in_RDI;
  HighsTask *t;
  bool cancelled;
  HighsTask *in_stack_00000098;
  HighsSplitDeque *in_stack_000000a0;
  HighsSplitDeque *in_stack_00000100;
  undefined7 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffdf;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  pHVar1 = HighsTask::getStealerIfUnfinished
                     ((HighsTask *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                      in_RDI);
  *in_RDX = (long)pHVar1;
  if (*in_RDX == 0) {
    bVar3 = true;
  }
  else {
    if ((in_stack_ffffffffffffffdf & 1) == 0) {
      do {
        pHVar2 = stealWithRetryLoop(in_stack_00000100);
        if (pHVar2 == (HighsTask *)0x0) break;
        runStolenTask(in_stack_000000a0,in_stack_00000098);
        bVar3 = HighsTask::isFinished
                          ((HighsTask *)
                           CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      } while (((bVar3 ^ 0xffU) & 1) != 0);
    }
    bVar3 = HighsTask::isFinished
                      ((HighsTask *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  }
  return bVar3;
}

Assistant:

bool leapfrogStolenTask(HighsTask* task, HighsSplitDeque*& stealer) {
    bool cancelled;
    stealer = task->getStealerIfUnfinished(&cancelled);

    if (stealer == nullptr) return true;

    if (!cancelled) {
      do {
        HighsTask* t = stealer->stealWithRetryLoop();
        if (t == nullptr) break;
        runStolenTask(t);
      } while (!task->isFinished());
    }

    return task->isFinished();
  }